

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_timer.cpp
# Opt level: O0

void AkarinTimer::mark_end(char *p_mark)

{
  float fVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  float local_44;
  float *local_40;
  float *current_time;
  _Node_iterator_base<std::pair<const_char_*const,_float>,_false> local_30;
  _Node_iterator_base<std::pair<const_char_*const,_float>,_false> local_28;
  _Node_iterator_base<std::pair<const_char_*const,_float>,_false> local_20;
  _Node_iterator_base<std::pair<const_char_*const,_float>,_false> local_18;
  _Node_const_iterator<std::pair<const_char_*const,_float>,_false,_false> find_iter;
  char *p_mark_local;
  
  find_iter.super__Node_iterator_base<std::pair<const_char_*const,_float>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_char_*const,_float>,_false>)
       (_Node_iterator_base<std::pair<const_char_*const,_float>,_false>)p_mark;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_char_*,_float,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<std::pair<const_char_*const,_float>_>_>
       ::cbegin(&chrono_timer_marks);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_char_*,_float,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<std::pair<const_char_*const,_float>_>_>
       ::cend(&chrono_timer_marks);
  local_30 = find_iter.super__Node_iterator_base<std::pair<const_char_*const,_float>,_false>._M_cur;
  local_18._M_cur =
       (__node_type *)
       std::
       find_if<std::__detail::_Node_const_iterator<std::pair<char_const*const,float>,false,false>,AkarinTimer::mark_end(char_const*)::__0>
                 (local_20._M_cur,
                  (_Node_const_iterator<std::pair<const_char_*const,_float>,_false,_false>)
                  local_28._M_cur,
                  find_iter.super__Node_iterator_base<std::pair<const_char_*const,_float>,_false>.
                  _M_cur);
  current_time = (float *)std::
                          unordered_map<const_char_*,_float,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<std::pair<const_char_*const,_float>_>_>
                          ::cend(&chrono_timer_marks);
  bVar2 = std::__detail::operator==
                    (&local_18,
                     (_Node_iterator_base<std::pair<const_char_*const,_float>,_false> *)
                     &current_time);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "you are attempting to close a marker that have not been registered");
    std::operator<<(poVar3,"\n");
  }
  else {
    local_44 = get_current_time();
    local_40 = &local_44;
    poVar3 = std::operator<<((ostream *)&std::cout,"timer_mark name:");
    poVar3 = std::operator<<(poVar3,(char *)find_iter.
                                            super__Node_iterator_base<std::pair<const_char_*const,_float>,_false>
                                            ._M_cur);
    poVar3 = std::operator<<(poVar3," time:");
    fVar1 = *local_40;
    pmVar4 = std::
             unordered_map<const_char_*,_float,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<std::pair<const_char_*const,_float>_>_>
             ::operator[](&chrono_timer_marks,(key_type *)&find_iter);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar1 - *pmVar4);
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

void AkarinTimer::mark_end(
    const char *p_mark) noexcept
{
    auto find_iter = std::find_if(
        chrono_timer_marks.cbegin(),
        chrono_timer_marks.cend(),
        [p_mark](const std::pair<const char *, float> &p_timer_iter) -> bool {
            return strcmp(p_mark, p_timer_iter.first) == 0;
        });
    if (find_iter == chrono_timer_marks.cend())
    {
        std::cerr << "you are attempting to close a marker that have not been registered"
                  << "\n";
        return;
    }

    const auto &current_time = get_current_time();
    std::cout << "timer_mark name:" << p_mark << " time:" << current_time - chrono_timer_marks[p_mark] << "\n";
}